

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_streamable<trng::snedecor_f_dist<double>>(snedecor_f_dist<double> *d)

{
  param_type pVar1;
  param_type p_new;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  param_type local_230;
  StringRef local_228;
  AssertionHandler local_218;
  StringRef local_1d0;
  SourceLineInfo local_1c0;
  stringstream local_1b0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [112];
  ios_base local_130 [264];
  
  local_230.n_ = 1;
  local_230.m_ = 1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  trng::operator<<(local_1a0,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b0,&local_230);
  pVar1 = local_230;
  local_228.m_start = "REQUIRE";
  local_228.m_size = 7;
  local_1c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1c0.line = 0xcd;
  Catch::StringRef::StringRef(&local_1d0,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler(&local_218,&local_228,&local_1c0,local_1d0,Normal);
  local_228.m_start =
       (char *)CONCAT71(local_228.m_start._1_7_,pVar1.m_ == (d->P).m_ && pVar1.n_ == (d->P).n_);
  Catch::AssertionHandler::handleExpr<bool>(&local_218,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}